

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O1

_Bool GPU_SaveSurface_RW(SDL_Surface *surface,SDL_RWops *rwops,_Bool free_rwops,
                        GPU_FileFormatEnum format)

{
  int y;
  void *data;
  int iVar1;
  bool bVar2;
  
  if (((rwops == (SDL_RWops *)0x0 || surface == (SDL_Surface *)0x0) ||
      (iVar1 = surface->w, iVar1 < 1)) || (y = surface->h, y < 1)) {
    return false;
  }
  if (format < 4) {
    data = surface->pixels;
    switch(format) {
    case GPU_FILE_AUTO:
      GPU_PushErrorCode("GPU_SaveSurface_RW",GPU_ERROR_DATA_ERROR,
                        "Invalid output file format (GPU_FILE_AUTO)");
      return false;
    case GPU_FILE_PNG:
      iVar1 = stbi_write_png_to_func
                        (write_func,rwops,iVar1,y,(uint)surface->format->BytesPerPixel,data,
                         surface->pitch);
      break;
    case GPU_FILE_BMP:
      iVar1 = stbi_write_bmp_to_func
                        (write_func,rwops,iVar1,y,(uint)surface->format->BytesPerPixel,data);
      break;
    case GPU_FILE_TGA:
      iVar1 = stbi_write_tga_to_func
                        (write_func,rwops,iVar1,y,(uint)surface->format->BytesPerPixel,data);
    }
    bVar2 = 0 < iVar1;
  }
  else {
    bVar2 = false;
    GPU_PushErrorCode("GPU_SaveSurface_RW",GPU_ERROR_DATA_ERROR,"Unsupported output file format");
  }
  if ((free_rwops & bVar2) != 1) {
    return bVar2;
  }
  SDL_RWclose(rwops);
  return bVar2;
}

Assistant:

GPU_bool GPU_SaveSurface_RW(SDL_Surface* surface, SDL_RWops* rwops, GPU_bool free_rwops, GPU_FileFormatEnum format)
{
    GPU_bool result;
    unsigned char* data;

    if(surface == NULL || rwops == NULL ||
            surface->w < 1 || surface->h < 1)
    {
        return GPU_FALSE;
    }

    data = surface->pixels;

    if(format == GPU_FILE_AUTO)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_DATA_ERROR, "Invalid output file format (GPU_FILE_AUTO)");
        return GPU_FALSE;
    }

    // FIXME: The limitations here are not communicated clearly.  BMP and TGA won't support arbitrary row length/pitch.
    switch(format)
    {
    case GPU_FILE_PNG:
        result = (stbi_write_png_to_func(write_func, rwops, surface->w, surface->h, surface->format->BytesPerPixel, (const unsigned char *const)data, surface->pitch) > 0);
        break;
    case GPU_FILE_BMP:
        result = (stbi_write_bmp_to_func(write_func, rwops, surface->w, surface->h, surface->format->BytesPerPixel, (const unsigned char *const)data) > 0);
        break;
    case GPU_FILE_TGA:
        result = (stbi_write_tga_to_func(write_func, rwops, surface->w, surface->h, surface->format->BytesPerPixel, (const unsigned char *const)data) > 0);
        break;
    default:
        GPU_PushErrorCode(__func__, GPU_ERROR_DATA_ERROR, "Unsupported output file format");
        result = GPU_FALSE;
        break;
    }

    if(result && free_rwops)
        SDL_RWclose(rwops);
    return result;
}